

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lup_matrix.cpp
# Opt level: O3

string * __thiscall LUPMatrix::ToString_abi_cxx11_(string *__return_storage_ptr__,LUPMatrix *this)

{
  ostream *poVar1;
  ostringstream out;
  long local_190 [14];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"L: ",3);
  std::ios::widen((char)(ostringstream *)local_190 + (char)*(undefined8 *)(local_190[0] + -0x18));
  std::ostream::put((char)local_190);
  std::ostream::flush();
  poVar1 = operator<<((ostream *)local_190,&this->l_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"U: ",3);
  std::ios::widen((char)(ostream *)local_190 + (char)*(undefined8 *)(local_190[0] + -0x18));
  std::ostream::put((char)local_190);
  std::ostream::flush();
  operator<<((ostream *)local_190,&this->u_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Row Permutation: ",0x11);
  std::ios::widen((char)(ostream *)local_190 + (char)*(undefined8 *)(local_190[0] + -0x18));
  std::ostream::put((char)local_190);
  std::ostream::flush();
  poVar1 = operator<<((ostream *)local_190,&this->row_permutation_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Column Permutation: ",0x14);
  std::ios::widen((char)(ostream *)local_190 + (char)*(undefined8 *)(local_190[0] + -0x18));
  std::ostream::put((char)local_190);
  std::ostream::flush();
  operator<<((ostream *)local_190,&this->column_permutation_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string LUPMatrix::ToString() const {
  std::ostringstream out;
  out << "L: " << std::endl;
  out << l_ << std::endl;
  out << "U: " << std::endl;
  out << u_;
  out << "Row Permutation: " << std::endl;
  out << row_permutation_ << std::endl;
  out << "Column Permutation: " << std::endl;
  out << column_permutation_;

  return out.str();
}